

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O2

bool __thiscall
ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486>::parseReturnBuffer
          (ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uint8_t *buf;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  buf = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  bVar1 = ProtocolBase::isValid
                    (&this->super_ProtocolBase,buf,
                     (long)(buffer->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)buf);
  if (bVar1) {
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[7] != '\x01') {
      return false;
    }
    pcVar3 = "OK::ProtocolWrite::Write succeeded";
  }
  else {
    pcVar3 = "ERROR::ProtocolWrite::Received Frame is not valid";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return bVar1;
}

Assistant:

bool parseReturnBuffer(std::vector<uint8_t> &buffer) {
        if (!isValid(&buffer[0], buffer.size())) {
            std::cout << "ERROR::ProtocolWrite::Received Frame is not valid" << std::endl;
            return false;
        }

        if(buffer[7] == 0x01) {
            std::cout << "OK::ProtocolWrite::Write succeeded" << std::endl;
            return true;
        }
        else
            return false;

    }